

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.h
# Opt level: O0

void __thiscall CEExceptionHandler::CEExceptionHandler(CEExceptionHandler *this)

{
  char *pcVar1;
  exception *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int i;
  char **bcktrace;
  int size;
  void *array [100];
  allocator *__rhs;
  allocator local_391;
  string local_390 [32];
  string local_370 [36];
  int local_34c;
  long local_348;
  int local_32c;
  undefined1 local_328 [808];
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__CEExceptionHandler_001519d0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  std::__cxx11::string::string((string *)__lhs);
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::__cxx11::string::string((string *)(in_RDI + 0x68));
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  local_32c = backtrace(local_328,100);
  local_348 = backtrace_symbols(local_328,local_32c);
  std::__cxx11::string::operator+=
            ((string *)(in_RDI + 0x68),"Exception encountered. Printing backtrace...\n");
  for (local_34c = 0; local_34c < local_32c; local_34c = local_34c + 1) {
    pcVar1 = *(char **)(local_348 + (long)local_34c * 8);
    __rhs = &local_391;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,pcVar1,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x68),local_370);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
  }
  return;
}

Assistant:

CEExceptionHandler() {
        // get void*'s for all entries on the stack
        void *array[100];
        int size = backtrace(array, 100);

        // print out all the frames to stderr
        char** bcktrace = backtrace_symbols(array, size);

        backtrace_ += "Exception encountered. Printing backtrace...\n";
        for (int i = 0; i < size; i++) {
            backtrace_ += std::string(bcktrace[i]) + "\n";
        }
    }